

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

Violation mp::
          ComputeViolation<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int iVar2;
  CtxVal CVar3;
  pointer pdVar4;
  double dVar5;
  double dVar6;
  Violation VVar7;
  Violation VVar8;
  Violation VVar9;
  
  iVar2 = (c->super_FunctionalConstraint).result_var_;
  pdVar4 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar4[iVar2];
  if (x->recomp_vals_ == false) {
    dVar5 = dVar1 - ABS(pdVar4[(c->
                               super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>
                               ).args_._M_elems[0]]);
    CVar3 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar3 != CTX_POS) {
      if (CVar3 == CTX_NEG) {
        VVar9.viol_ = -dVar5;
        VVar9.valX_ = dVar1;
        return VVar9;
      }
      if (CVar3 == CTX_MIX) {
        VVar8.viol_ = ABS(dVar5);
        VVar8.valX_ = dVar1;
        return VVar8;
      }
      return (Violation)ZEXT816(0x7ff0000000000000);
    }
  }
  else {
    dVar6 = (x->lb_).data_[iVar2] - dVar1;
    dVar5 = dVar1 - (x->ub_).data_[iVar2];
    if (dVar5 <= dVar6) {
      dVar5 = dVar6;
    }
    if (dVar5 <= 0.0) {
      dVar5 = 0.0;
    }
    dVar5 = dVar5 + ABS(dVar1 - (x->x_raw_).data_[iVar2]);
  }
  VVar7.valX_ = dVar1;
  VVar7.viol_ = dVar5;
  return VVar7;
}

Assistant:

int GetResultVar() const { return result_var_; }